

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O0

double __thiscall S2::GetArea(S2 *this,S2PointLoopSpan loop)

{
  S2PointLoopSpan loop_00;
  ostream *poVar1;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  S2 *local_30;
  pointer local_28;
  double local_20;
  double area;
  S2PointLoopSpan loop_local;
  
  local_28 = loop.super_S2PointSpan.ptr_;
  loop_00.super_S2PointSpan.len_ = (size_type)local_28;
  loop_00.super_S2PointSpan.ptr_ = (pointer)this;
  local_30 = this;
  area = (double)this;
  loop_local.super_S2PointSpan.ptr_ = local_28;
  local_20 = GetSignedArea(loop_00);
  if (ABS(local_20) <= 6.283185307179586) {
    if (local_20 < 0.0) {
      local_20 = local_20 + 12.566370614359172;
    }
    return local_20;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
             ,0x31,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_48);
  poVar1 = std::operator<<(poVar1,"Check failed: (fabs(area)) <= (2 * 3.14159265358979323846) ");
  S2LogMessageVoidify::operator&(&local_31,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

double GetArea(S2PointLoopSpan loop) {
  double area = GetSignedArea(loop);
  S2_DCHECK_LE(fabs(area), 2 * M_PI);
  if (area < 0.0) area += 4 * M_PI;
  return area;
}